

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void encode_superblock(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **t,
                      RUN_TYPE dry_run,BLOCK_SIZE bsize,int *rate)

{
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  uint *puVar1;
  byte bVar2;
  int mi_row;
  int mi_col;
  MB_MODE_INFO *mi;
  MB_MODE_INFO *pMVar3;
  bool bVar4;
  byte bVar5;
  scale_factors *psVar6;
  long lVar7;
  RefCntBuffer *pRVar8;
  TX_SIZE_SEARCH_METHOD TVar9;
  TX_MODE TVar10;
  byte bVar11;
  char val;
  uint uVar12;
  uint uVar13;
  SequenceHeader *pSVar14;
  YV12_BUFFER_CONFIG *src;
  int iVar15;
  uint uVar16;
  byte bVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  uint8_t uVar21;
  ulong uVar22;
  int idy;
  int iVar23;
  int idx;
  int blk_col;
  MB_MODE_INFO **ppMVar24;
  int plane;
  int iVar25;
  bool bVar26;
  int mi_width;
  int mi_height;
  
  uVar21 = ((cpi->common).seq_params)->monochrome;
  ppMVar24 = (td->mb).e_mbd.mi;
  mi = *ppMVar24;
  if ((cpi->common).seg.enabled == '\0') {
    bVar17 = 0;
  }
  else {
    bVar17 = ((byte)(cpi->common).seg.feature_mask[*(ushort *)&mi->field_0xa7 & 7] & 0x40) >> 6;
  }
  bVar26 = true;
  if (-1 < (char)*(ushort *)&mi->field_0xa7) {
    bVar26 = '\0' < mi->ref_frame[0];
  }
  iVar23 = (cpi->common).mi_params.mi_stride;
  bVar11 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  uVar16 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize]
  ;
  TVar9 = (cpi->winner_mode_params).tx_size_search_methods[0];
  iVar15 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
  (td->mb).txfm_search_params.tx_size_search_method = TVar9;
  if (iVar15 != 0) {
    TVar9 = (cpi->winner_mode_params).tx_size_search_methods[2];
    (td->mb).txfm_search_params.tx_size_search_method = TVar9;
  }
  cm = &cpi->common;
  iVar15 = (uint)(uVar21 == '\0') * 2 + 1;
  xd = &(td->mb).e_mbd;
  TVar10 = '\x02' - (TVar9 == '\x02');
  if ((cpi->common).features.coded_lossless != false) {
    TVar10 = '\0';
  }
  (td->mb).txfm_search_params.tx_mode_search_type = TVar10;
  mi_row = (td->mb).e_mbd.mi_row;
  mi_col = (td->mb).e_mbd.mi_col;
  uVar18 = (uint)bVar11;
  if (bVar26) {
    bVar11 = mi->ref_frame[0];
    bVar2 = mi->ref_frame[1];
    if ((char)bVar11 < '\t') {
      bVar5 = 1;
      if ('\x01' < (char)bVar11) {
        bVar5 = bVar11;
      }
      iVar25 = (cpi->common).remapped_ref_idx[bVar5 - 1];
      if (iVar25 == -1) goto LAB_001e1663;
      psVar6 = (cpi->common).ref_scale_factors + iVar25;
    }
    else {
LAB_001e1663:
      psVar6 = (scale_factors *)0x0;
    }
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar6;
    if ((char)bVar2 < '\t') {
      bVar11 = 1;
      if ('\x01' < (char)bVar2) {
        bVar11 = bVar2;
      }
      iVar25 = (cpi->common).remapped_ref_idx[bVar11 - 1];
      if (iVar25 == -1) goto LAB_001e16a9;
      psVar6 = (cpi->common).ref_scale_factors + iVar25;
    }
    else {
LAB_001e16a9:
      psVar6 = (scale_factors *)0x0;
    }
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar6;
    bVar11 = 1;
    lVar19 = 0;
    do {
      if (((byte)(mi->ref_frame[lVar19] - 1U) < 8) &&
         (lVar7 = (long)(cpi->common).remapped_ref_idx[(byte)mi->ref_frame[lVar19] - 1], lVar7 != -1
         )) {
        pRVar8 = (cpi->common).ref_frame_map[lVar7];
      }
      else {
        pRVar8 = (RefCntBuffer *)0x0;
      }
      src = &pRVar8->buf;
      if (pRVar8 == (RefCntBuffer *)0x0) {
        src = (YV12_BUFFER_CONFIG *)0x0;
      }
      av1_setup_pre_planes
                (xd,(int)lVar19,src,mi_row,mi_col,(td->mb).e_mbd.block_ref_scale_factors[lVar19],
                 iVar15);
      lVar19 = 1;
      bVar4 = (bool)(bVar11 & '\0' < (char)bVar2);
      bVar11 = 0;
    } while (bVar4);
    if ((td->mb).reuse_inter_pred == false) {
      pSVar14 = (cpi->common).seq_params;
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      pSVar14 = (cpi->common).seq_params;
      if ((cpi->sf).rt_sf.nonrd_check_partition_split == 0) {
        uVar12 = (uint)(pSVar14->bit_depth == AOM_BITS_8);
      }
    }
    av1_enc_build_inter_predictor
              (cm,xd,mi_row,mi_col,(BUFFER_SET *)0x0,bsize,uVar12,
               (uint)(pSVar14->monochrome == '\0') * 2);
    if (mi->motion_mode == '\x01') {
      av1_build_obmc_inter_predictors_sb(cm,xd);
    }
    av1_encode_sb(cpi,&td->mb,bsize,dry_run);
    uVar21 = '\0';
    av1_tokenize_sb_vartx(cpi,td,dry_run,bsize,(int *)0x0,tile_data->allow_update_cdf);
  }
  else {
    if (uVar21 == '\0') {
      uVar12 = 1;
      if ((td->mb).e_mbd.is_chroma_ref == true) {
        if ((mi->field_0xa7 & 0x80) != 0) goto LAB_001e165c;
        uVar12 = 0;
        if (mi->ref_frame[0] < '\x01') {
          uVar12 = (uint)(mi->uv_mode == '\r');
        }
      }
    }
    else {
LAB_001e165c:
      uVar12 = 0;
    }
    (td->mb).e_mbd.cfl.store_y = uVar12;
    mi->skip_txfm = '\x01';
    iVar25 = 0;
    do {
      av1_encode_intra_block_plane
                (cpi,&td->mb,bsize,iVar25,dry_run,
                 cpi->optimize_seg_arr[*(ushort *)&mi->field_0xa7 & 7]);
      iVar25 = iVar25 + 1;
    } while (iVar15 != iVar25);
    if ((((cpi->common).seg.segid_preskip == '\0') && ((cpi->common).seg.update_map != '\0')) &&
       ((cpi->enc_seg).has_lossless_segment == true)) {
      mi->skip_txfm = '\0';
    }
    (td->mb).e_mbd.cfl.store_y = 0;
    if (((cpi->common).features.allow_screen_content_tools != false) &&
       ((BLOCK_128X128 < bsize || ((0xe007U >> (bsize & 0x1f) & 1) == 0)))) {
      bVar11 = 1;
      lVar19 = 0;
      do {
        if ((dry_run == '\0') && ((mi->palette_mode_info).palette_size[lVar19] != '\0')) {
          av1_tokenize_color_map
                    (&td->mb,(int)lVar19,t,bsize,mi->tx_size,'\0',(uint)tile_data->allow_update_cdf,
                     td->counts);
        }
        lVar19 = 1;
        bVar4 = (bool)(uVar21 == '\0' & bVar11);
        bVar11 = 0;
      } while (bVar4);
    }
    uVar21 = tile_data->allow_update_cdf;
    av1_update_intra_mb_txb_context(cpi,td,dry_run,bsize,uVar21);
  }
  if (dry_run == '\0') {
    if ((((((cm->current_frame).frame_type & 0xfd) == 0) &&
         ((cpi->common).features.allow_screen_content_tools == true)) &&
        ((cpi->common).features.allow_intrabc != false)) && ((mi->field_0xa7 & 0x80) != 0)) {
      td->intrabc_used = 1;
    }
    uVar22 = (ulong)(td->mb).txfm_search_params.tx_mode_search_type;
    if (((uVar22 == 2) &&
        (uVar12 = *(ushort *)&mi->field_0xa7 & 7, (td->mb).e_mbd.lossless[uVar12] == 0)) &&
       (mi->bsize != BLOCK_4X4)) {
      if (bVar26) {
        if (mi->skip_txfm != '\0' || bVar17 != 0) goto LAB_001e19c6;
        tx_partition_count_update
                  (cm,&td->mb,bsize,(FRAME_COUNTS *)(ulong)tile_data->allow_update_cdf,uVar21);
      }
      else {
        bVar11 = mi->tx_size;
        bVar2 = ""[bsize];
        if (bVar11 != bVar2) {
          puVar1 = &(td->mb).txfm_search_info.txb_split_count;
          *puVar1 = *puVar1 + 1;
        }
        if (bsize != BLOCK_4X4) {
          uVar12 = get_tx_size_context(xd);
          val = '\0';
          for (; bVar11 != bVar2; bVar2 = ""[bVar2]) {
            val = val + '\x01';
          }
          if (tile_data->allow_update_cdf != '\0') {
            update_cdf(((td->mb).e_mbd.tile_ctx)->tx_size_cdf
                       [(ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] - 1]
                       [uVar12],val,(byte)bsize_to_max_depth_bsize_to_max_depth_table[bsize] + 1);
          }
        }
      }
    }
    else {
      if (bVar26) {
        uVar12 = *(ushort *)&mi->field_0xa7 & 7;
LAB_001e19c6:
        if ((td->mb).e_mbd.lossless[uVar12] == 0) {
          bVar2 = ""[uVar22];
          if (bsize == BLOCK_4X4) {
            bVar11 = bVar2;
            if (""[bsize] < bVar2) {
              bVar11 = ""[bsize];
            }
          }
          else {
            bVar11 = ""[bsize];
            if (bVar2 < ""[""[bsize]]) {
              bVar11 = bVar2;
            }
          }
        }
        else {
          bVar11 = 0;
        }
      }
      else {
        bVar11 = mi->tx_size;
      }
      uVar12 = (cpi->common).mi_params.mi_rows - mi_row;
      if ((int)uVar16 <= (int)uVar12) {
        uVar12 = uVar16;
      }
      if (0 < (int)uVar12) {
        uVar13 = (cpi->common).mi_params.mi_cols - mi_col;
        if ((int)uVar18 <= (int)uVar13) {
          uVar13 = uVar18;
        }
        uVar22 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar20 = 0;
            do {
              ppMVar24[uVar20]->tx_size = bVar11;
              uVar20 = uVar20 + 1;
            } while (uVar13 != uVar20);
          }
          uVar22 = uVar22 + 1;
          ppMVar24 = ppMVar24 + iVar23;
        } while (uVar22 != uVar12);
      }
      if (bVar11 != ""[bsize]) {
        puVar1 = &(td->mb).txfm_search_info.txb_split_count;
        *puVar1 = *puVar1 + 1;
      }
    }
  }
  uVar22 = (ulong)(td->mb).txfm_search_params.tx_mode_search_type;
  if ((uVar22 == 2) && (bVar26 && mi->bsize != BLOCK_4X4)) {
    if ((mi->skip_txfm != '\0' || bVar17 != 0) ||
       ((td->mb).e_mbd.lossless[*(ushort *)&mi->field_0xa7 & 7] != 0)) {
LAB_001e1bbb:
      if ((td->mb).e_mbd.lossless[*(ushort *)&mi->field_0xa7 & 7] == 0) {
        bVar11 = ""[uVar22];
        if (bsize == BLOCK_4X4) {
          if (""[bsize] < bVar11) {
            bVar11 = ""[bsize];
          }
        }
        else if (""[""[bsize]] <= bVar11) {
          bVar11 = ""[bsize];
        }
      }
      else {
        bVar11 = 0;
      }
      goto LAB_001e1c25;
    }
    if (dry_run != '\0') {
      iVar23 = 0;
      uVar12 = 0;
      if ((td->mb).e_mbd.lossless[*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7] == 0) {
        uVar12 = (uint)""[bsize];
      }
      iVar15 = *(int *)((long)tx_size_high_unit + (ulong)(uVar12 << 2));
      iVar25 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar12 << 2));
      (td->mb).e_mbd.above_txfm_context =
           (cpi->common).above_contexts.txfm[(td->mb).e_mbd.tile.tile_row] + (td->mb).e_mbd.mi_col;
      (td->mb).e_mbd.left_txfm_context =
           (td->mb).e_mbd.left_txfm_context_buffer + ((td->mb).e_mbd.mi_row & 0x1f);
      do {
        blk_col = 0;
        do {
          set_txfm_context(xd,(TX_SIZE)uVar12,iVar23,blk_col);
          blk_col = blk_col + iVar25;
        } while (blk_col < (int)uVar18);
        iVar23 = iVar23 + iVar15;
      } while (iVar23 < (int)uVar16);
    }
  }
  else {
    if (bVar26) goto LAB_001e1bbb;
    bVar11 = mi->tx_size;
    if (bsize == BLOCK_4X4) {
      bVar11 = 0;
    }
LAB_001e1c25:
    mi->tx_size = bVar11;
    bVar2 = (td->mb).e_mbd.width;
    bVar5 = (td->mb).e_mbd.height;
    if (mi->skip_txfm == '\0' && bVar17 == 0) {
      uVar16 = (uint)*(byte *)(tx_size_high + bVar11);
      bVar26 = true;
    }
    else if ((mi->field_0xa7 & 0x80) == 0) {
      bVar26 = mi->ref_frame[0] < '\x01';
      if (mi->ref_frame[0] < '\x01') {
        uVar16 = tx_size_high[bVar11];
      }
      else {
        uVar16 = (uint)bVar5 * 4 & 0xff;
      }
    }
    else {
      uVar16 = (uint)bVar5 * 4;
      bVar26 = false;
    }
    if ((ulong)bVar2 != 0) {
      if (bVar26) {
        uVar18 = tx_size_wide[bVar11];
      }
      else {
        uVar18 = (uint)bVar2 * 4 & 0xff;
      }
      memset((td->mb).e_mbd.above_txfm_context,uVar18,(ulong)bVar2);
    }
    if ((ulong)bVar5 != 0) {
      memset((td->mb).e_mbd.left_txfm_context,uVar16 & 0xff,(ulong)bVar5);
    }
  }
  if ((((mi->field_0xa7 & 0x80) != 0) || ('\0' < mi->ref_frame[0])) &&
     ((td->mb).e_mbd.is_chroma_ref == false)) {
    pMVar3 = *(td->mb).e_mbd.mi;
    uVar22 = (ulong)pMVar3->bsize;
    if ((td->mb).e_mbd.lossless[*(ushort *)&pMVar3->field_0xa7 & 7] == 0) {
      bVar26 = (0x2f0bffUL >> (uVar22 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar22 & 0x3f) & 1) == 0) goto LAB_001e1d8a;
    }
    else {
      bVar26 = av1_ss_size_lookup[uVar22][(td->mb).e_mbd.plane[1].subsampling_x]
               [(td->mb).e_mbd.plane[1].subsampling_y] == BLOCK_4X4;
    }
    if (bVar26) {
      cfl_store_block(xd,mi->bsize,mi->tx_size);
    }
  }
LAB_001e1d8a:
  if ((((dry_run == '\0') && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
      (((cpi->svc).temporal_layer_id == 0 && ((cpi->sf).rt_sf.use_temporal_noise_estimate != 0))))
     && ((cpi->ppi->use_svc == 0 ||
         ((((cpi->svc).layer_context)->is_key_frame == 0 &&
          ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))))) {
    update_zeromv_cnt(cpi,mi,mi_row,mi_col,bsize);
    return;
  }
  return;
}

Assistant:

static void encode_superblock(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                              ThreadData *td, TokenExtra **t, RUN_TYPE dry_run,
                              BLOCK_SIZE bsize, int *rate) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO **mi_4x4 = xd->mi;
  MB_MODE_INFO *mbmi = mi_4x4[0];
  const int seg_skip =
      segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP);
  const int mis = cm->mi_params.mi_stride;
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];
  const int is_inter = is_inter_block(mbmi);

  // Initialize tx_mode and tx_size_search_method
  TxfmSearchParams *txfm_params = &x->txfm_search_params;
  set_tx_size_search_method(
      cm, &cpi->winner_mode_params, txfm_params,
      cpi->sf.winner_mode_sf.enable_winner_mode_for_tx_size_srch, 1);

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  if (!is_inter) {
    xd->cfl.store_y = store_cfl_required(cm, xd);
    mbmi->skip_txfm = 1;
    for (int plane = 0; plane < num_planes; ++plane) {
      av1_encode_intra_block_plane(cpi, x, bsize, plane, dry_run,
                                   cpi->optimize_seg_arr[mbmi->segment_id]);
    }

    // If there is at least one lossless segment, force the skip for intra
    // block to be 0, in order to avoid the segment_id to be changed by in
    // write_segment_id().
    if (!cpi->common.seg.segid_preskip && cpi->common.seg.update_map &&
        cpi->enc_seg.has_lossless_segment)
      mbmi->skip_txfm = 0;

    xd->cfl.store_y = 0;
    if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
      for (int plane = 0; plane < AOMMIN(2, num_planes); ++plane) {
        if (mbmi->palette_mode_info.palette_size[plane] > 0) {
          if (!dry_run) {
            av1_tokenize_color_map(x, plane, t, bsize, mbmi->tx_size,
                                   PALETTE_MAP, tile_data->allow_update_cdf,
                                   td->counts);
          } else if (dry_run == DRY_RUN_COSTCOEFFS) {
            *rate +=
                av1_cost_color_map(x, plane, bsize, mbmi->tx_size, PALETTE_MAP);
          }
        }
      }
    }

    av1_update_intra_mb_txb_context(cpi, td, dry_run, bsize,
                                    tile_data->allow_update_cdf);
  } else {
    int ref;
    const int is_compound = has_second_ref(mbmi);

    set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    for (ref = 0; ref < 1 + is_compound; ++ref) {
      const YV12_BUFFER_CONFIG *cfg =
          get_ref_frame_yv12_buf(cm, mbmi->ref_frame[ref]);
      assert(IMPLIES(!is_intrabc_block(mbmi), cfg));
      av1_setup_pre_planes(xd, ref, cfg, mi_row, mi_col,
                           xd->block_ref_scale_factors[ref], num_planes);
    }
    // Predicted sample of inter mode (for Luma plane) cannot be reused if
    // nonrd_check_partition_split speed feature is enabled, Since in such cases
    // the buffer may not contain the predicted sample of best mode.
    const int start_plane =
        (x->reuse_inter_pred && (!cpi->sf.rt_sf.nonrd_check_partition_split) &&
         cm->seq_params->bit_depth == AOM_BITS_8)
            ? 1
            : 0;
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  start_plane, av1_num_planes(cm) - 1);
    if (mbmi->motion_mode == OBMC_CAUSAL) {
      assert(cpi->oxcf.motion_mode_cfg.enable_obmc);
      av1_build_obmc_inter_predictors_sb(cm, xd);
    }

#if CONFIG_MISMATCH_DEBUG
    if (dry_run == OUTPUT_ENABLED) {
      for (int plane = 0; plane < num_planes; ++plane) {
        const struct macroblockd_plane *pd = &xd->plane[plane];
        int pixel_c, pixel_r;
        mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, 0, 0,
                        pd->subsampling_x, pd->subsampling_y);
        if (!is_chroma_reference(mi_row, mi_col, bsize, pd->subsampling_x,
                                 pd->subsampling_y))
          continue;
        mismatch_record_block_pre(pd->dst.buf, pd->dst.stride,
                                  cm->current_frame.order_hint, plane, pixel_c,
                                  pixel_r, pd->width, pd->height,
                                  xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
      }
    }
#else
    (void)num_planes;
#endif

    av1_encode_sb(cpi, x, bsize, dry_run);
    av1_tokenize_sb_vartx(cpi, td, dry_run, bsize, rate,
                          tile_data->allow_update_cdf);
  }

  if (!dry_run) {
    if (av1_allow_intrabc(cm) && is_intrabc_block(mbmi)) td->intrabc_used = 1;
    if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
        !xd->lossless[mbmi->segment_id] && mbmi->bsize > BLOCK_4X4 &&
        !(is_inter && (mbmi->skip_txfm || seg_skip))) {
      if (is_inter) {
        tx_partition_count_update(cm, x, bsize, td->counts,
                                  tile_data->allow_update_cdf);
      } else {
        if (mbmi->tx_size != max_txsize_rect_lookup[bsize])
          ++x->txfm_search_info.txb_split_count;
        if (block_signals_txsize(bsize)) {
          const int tx_size_ctx = get_tx_size_context(xd);
          const int32_t tx_size_cat = bsize_to_tx_size_cat(bsize);
          const int depth = tx_size_to_depth(mbmi->tx_size, bsize);
          const int max_depths = bsize_to_max_depth(bsize);

          if (tile_data->allow_update_cdf)
            update_cdf(xd->tile_ctx->tx_size_cdf[tx_size_cat][tx_size_ctx],
                       depth, max_depths + 1);
#if CONFIG_ENTROPY_STATS
          ++td->counts->intra_tx_size[tx_size_cat][tx_size_ctx][depth];
#endif
        }
      }
      assert(IMPLIES(is_rect_tx(mbmi->tx_size), is_rect_tx_allowed(xd, mbmi)));
    } else {
      int i, j;
      TX_SIZE intra_tx_size;
      // The new intra coding scheme requires no change of transform size
      if (is_inter) {
        if (xd->lossless[mbmi->segment_id]) {
          intra_tx_size = TX_4X4;
        } else {
          intra_tx_size =
              tx_size_from_tx_mode(bsize, txfm_params->tx_mode_search_type);
        }
      } else {
        intra_tx_size = mbmi->tx_size;
      }

      const int cols = AOMMIN(cm->mi_params.mi_cols - mi_col, mi_width);
      const int rows = AOMMIN(cm->mi_params.mi_rows - mi_row, mi_height);
      for (j = 0; j < rows; j++) {
        for (i = 0; i < cols; i++) mi_4x4[mis * j + i]->tx_size = intra_tx_size;
      }

      if (intra_tx_size != max_txsize_rect_lookup[bsize])
        ++x->txfm_search_info.txb_split_count;
    }
  }

  if (txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
      block_signals_txsize(mbmi->bsize) && is_inter &&
      !(mbmi->skip_txfm || seg_skip) && !xd->lossless[mbmi->segment_id]) {
    if (dry_run) tx_partition_set_contexts(cm, xd, bsize);
  } else {
    TX_SIZE tx_size = mbmi->tx_size;
    // The new intra coding scheme requires no change of transform size
    if (is_inter) {
      if (xd->lossless[mbmi->segment_id]) {
        tx_size = TX_4X4;
      } else {
        tx_size = tx_size_from_tx_mode(bsize, txfm_params->tx_mode_search_type);
      }
    } else {
      tx_size = (bsize > BLOCK_4X4) ? tx_size : TX_4X4;
    }
    mbmi->tx_size = tx_size;
    set_txfm_ctxs(tx_size, xd->width, xd->height,
                  (mbmi->skip_txfm || seg_skip) && is_inter_block(mbmi), xd);
  }

#if !CONFIG_REALTIME_ONLY
  if (is_inter_block(mbmi) && !xd->is_chroma_ref && is_cfl_allowed(xd)) {
    cfl_store_block(xd, mbmi->bsize, mbmi->tx_size);
  }
#endif
  if (!dry_run) {
    if (cpi->oxcf.pass == AOM_RC_ONE_PASS && cpi->svc.temporal_layer_id == 0 &&
        cpi->sf.rt_sf.use_temporal_noise_estimate &&
        (!cpi->ppi->use_svc ||
         (cpi->ppi->use_svc &&
          !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame &&
          cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1)))
      update_zeromv_cnt(cpi, mbmi, mi_row, mi_col, bsize);
  }
}